

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O1

void __thiscall Generators_Hammersley3D_Test::TestBody(Generators_Hammersley3D_Test *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  char *pcVar6;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [64];
  undefined1 auVar11 [56];
  undefined1 auVar10 [64];
  undefined1 extraout_var [56];
  undefined4 in_XMM2_Da;
  undefined1 in_register_00001284 [12];
  Point3f PVar12;
  int count;
  AssertionResult gtest_ar;
  Hammersley3DIter __begin1;
  Float invBase_1;
  Float invBase;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  int local_6c;
  internal local_68 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  undefined8 local_58;
  float local_50 [2];
  AssertHelper local_48;
  AssertHelper local_40;
  float local_38;
  float local_34;
  
  local_6c = 0;
  local_48.data_ = (AssertHelperData *)0x8000000000;
  local_34 = 0.5;
  local_38 = 0.33333334;
  auVar9 = ZEXT464(0x3eaaaaab);
  do {
    auVar11 = auVar9._8_56_;
    PVar12 = pbrt::detail::Hammersley3DIter::operator*((Hammersley3DIter *)&local_48);
    local_50[0] = PVar12.super_Tuple3<pbrt::Point3,_float>.z;
    auVar10._0_8_ = PVar12.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar10._8_56_ = auVar11;
    local_58 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               vmovlps_avx(auVar10._0_16_);
    local_78.ptr_._0_4_ = (float)local_6c * 0.0078125;
    testing::internal::CmpHelperEQ<float,float>
              (local_68,"(Float)count / 128.f","u[0]",(float *)&local_78,(float *)&local_58);
    if (local_68[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_78);
      pcVar6 = "";
      if (local_60.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar6 = ((local_60.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
                 ,0x49a,pcVar6);
      testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_78);
      testing::internal::AssertHelper::~AssertHelper(&local_40);
      if (local_78.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (local_78.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_78.ptr_ + 8))();
        }
        local_78.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if ((long)local_6c == 0) {
      auVar8 = ZEXT816(0) << 0x40;
    }
    else {
      fVar7 = 1.0;
      lVar5 = 0;
      uVar4 = (long)local_6c;
      do {
        lVar5 = (lVar5 - uVar4 / 2) * 2 + uVar4;
        fVar7 = local_34 * fVar7;
        bVar2 = 1 < uVar4;
        uVar4 = uVar4 / 2;
      } while (bVar2);
      auVar8._4_12_ = in_register_00001284;
      auVar8._0_4_ = in_XMM2_Da;
      auVar8 = vcvtusi2ss_avx512f(auVar8,lVar5);
      auVar8 = ZEXT416((uint)(fVar7 * auVar8._0_4_));
    }
    auVar8 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar8);
    local_78.ptr_._0_4_ = (float)auVar8._0_4_;
    testing::internal::CmpHelperEQ<float,float>
              (local_68,"RadicalInverse(0, count)","u[1]",(float *)&local_78,
               (float *)((long)&local_58 + 4));
    if (local_68[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_78);
      pcVar6 = "";
      if (local_60.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar6 = ((local_60.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
                 ,0x49b,pcVar6);
      testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_78);
      testing::internal::AssertHelper::~AssertHelper(&local_40);
      if (local_78.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (local_78.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_78.ptr_ + 8))();
        }
        local_78.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if ((long)local_6c == 0) {
      auVar8 = ZEXT816(0) << 0x40;
    }
    else {
      fVar7 = 1.0;
      lVar5 = 0;
      uVar4 = (long)local_6c;
      do {
        lVar5 = (lVar5 - uVar4 / 3) * 3 + uVar4;
        fVar7 = local_38 * fVar7;
        bVar2 = 2 < uVar4;
        uVar4 = uVar4 / 3;
      } while (bVar2);
      auVar1._4_12_ = in_register_00001284;
      auVar1._0_4_ = in_XMM2_Da;
      auVar8 = vcvtusi2ss_avx512f(auVar1,lVar5);
      auVar8 = ZEXT416((uint)(fVar7 * auVar8._0_4_));
    }
    auVar8 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar8);
    auVar9 = ZEXT1664(auVar8);
    local_78.ptr_._0_4_ = (float)auVar8._0_4_;
    testing::internal::CmpHelperEQ<float,float>
              (local_68,"RadicalInverse(1, count)","u[2]",(float *)&local_78,local_50);
    if (local_68[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_78);
      pcVar6 = "";
      if (local_60.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar6 = ((local_60.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
                 ,0x49c,pcVar6);
      testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_78);
      testing::internal::AssertHelper::~AssertHelper(&local_40);
      if (local_78.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (local_78.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          auVar9._0_8_ = (**(code **)(*(long *)local_78.ptr_ + 8))();
          auVar9._8_56_ = extraout_var;
        }
        local_78.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_6c = local_6c + 1;
    iVar3 = (int)local_48.data_ + 1;
    local_48.data_._0_4_ = iVar3;
  } while (iVar3 != 0x80);
  local_58._0_4_ = 0x80;
  testing::internal::CmpHelperEQ<int,int>(local_68,"128","count",(int *)&local_58,&local_6c);
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_60.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_60.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
               ,0x49f,pcVar6);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (local_58 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_58 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         )) {
        (**(code **)(*(long *)local_58 + 8))();
      }
      local_58 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(Generators, Hammersley3D) {
    int count = 0;
    for (Point3f u : Hammersley3D(128)) {
        EXPECT_EQ((Float)count / 128.f, u[0]);
        EXPECT_EQ(RadicalInverse(0, count), u[1]);
        EXPECT_EQ(RadicalInverse(1, count), u[2]);
        ++count;
    }
    EXPECT_EQ(128, count);
}